

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O2

void __thiscall DIS::AggregateStatePdu::unmarshal(AggregateStatePdu *this,DataStream *dataStream)

{
  ulong uVar1;
  size_t idx;
  AggregateID x;
  VariableDatum local_60;
  
  EntityManagementFamilyPdu::unmarshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_aggregateID,dataStream);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_aggregateState);
  EntityType::unmarshal(&this->_aggregateType,dataStream);
  DataStream::operator>>(dataStream,&this->_formation);
  AggregateMarking::unmarshal(&this->_aggregateMarking,dataStream);
  Vector3Float::unmarshal(&this->_dimensions,dataStream);
  Orientation::unmarshal(&this->_orientation,dataStream);
  Vector3Double::unmarshal(&this->_centerOfMass,dataStream);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfDisAggregates);
  DataStream::operator>>(dataStream,&this->_numberOfDisEntities);
  DataStream::operator>>(dataStream,&this->_numberOfSilentAggregateTypes);
  DataStream::operator>>(dataStream,&this->_numberOfSilentEntityTypes);
  std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::clear(&this->_aggregateIDList);
  for (uVar1 = 0; uVar1 < this->_numberOfDisAggregates; uVar1 = uVar1 + 1) {
    AggregateID::AggregateID((AggregateID *)&local_60);
    AggregateID::unmarshal((AggregateID *)&local_60,dataStream);
    std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::push_back
              (&this->_aggregateIDList,(value_type *)&local_60);
    AggregateID::~AggregateID((AggregateID *)&local_60);
  }
  std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::clear(&this->_entityIDList);
  for (uVar1 = 0; uVar1 < this->_numberOfDisEntities; uVar1 = uVar1 + 1) {
    EntityID::EntityID((EntityID *)&local_60);
    EntityID::unmarshal((EntityID *)&local_60,dataStream);
    std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::push_back
              (&this->_entityIDList,(value_type *)&local_60);
    EntityID::~EntityID((EntityID *)&local_60);
  }
  DataStream::operator>>(dataStream,&this->_pad2);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::clear
            (&this->_silentAggregateSystemList);
  for (uVar1 = 0; uVar1 < this->_numberOfSilentAggregateTypes; uVar1 = uVar1 + 1) {
    EntityType::EntityType((EntityType *)&local_60);
    EntityType::unmarshal((EntityType *)&local_60,dataStream);
    std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
              (&this->_silentAggregateSystemList,(value_type *)&local_60);
    EntityType::~EntityType((EntityType *)&local_60);
  }
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::clear
            (&this->_silentEntitySystemList);
  for (uVar1 = 0; uVar1 < this->_numberOfSilentEntityTypes; uVar1 = uVar1 + 1) {
    EntityType::EntityType((EntityType *)&local_60);
    EntityType::unmarshal((EntityType *)&local_60,dataStream);
    std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
              (&this->_silentEntitySystemList,(value_type *)&local_60);
    EntityType::~EntityType((EntityType *)&local_60);
  }
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatumList);
  for (uVar1 = 0; uVar1 < this->_numberOfVariableDatumRecords; uVar1 = uVar1 + 1) {
    VariableDatum::VariableDatum(&local_60);
    VariableDatum::unmarshal(&local_60,dataStream);
    std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
              (&this->_variableDatumList,&local_60);
    VariableDatum::~VariableDatum(&local_60);
  }
  return;
}

Assistant:

void AggregateStatePdu::unmarshal(DataStream& dataStream)
{
    EntityManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _aggregateID.unmarshal(dataStream);
    dataStream >> _forceID;
    dataStream >> _aggregateState;
    _aggregateType.unmarshal(dataStream);
    dataStream >> _formation;
    _aggregateMarking.unmarshal(dataStream);
    _dimensions.unmarshal(dataStream);
    _orientation.unmarshal(dataStream);
    _centerOfMass.unmarshal(dataStream);
    _velocity.unmarshal(dataStream);
    dataStream >> _numberOfDisAggregates;
    dataStream >> _numberOfDisEntities;
    dataStream >> _numberOfSilentAggregateTypes;
    dataStream >> _numberOfSilentEntityTypes;

     _aggregateIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisAggregates; idx++)
     {
        AggregateID x;
        x.unmarshal(dataStream);
        _aggregateIDList.push_back(x);
     }

     _entityIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisEntities; idx++)
     {
        EntityID x;
        x.unmarshal(dataStream);
        _entityIDList.push_back(x);
     }
    dataStream >> _pad2;

     _silentAggregateSystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentAggregateTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentAggregateSystemList.push_back(x);
     }

     _silentEntitySystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentEntityTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentEntitySystemList.push_back(x);
     }
    dataStream >> _numberOfVariableDatumRecords;

     _variableDatumList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatumList.push_back(x);
     }
}